

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O2

void * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AddString(RepeatedPtrFieldBase *this)

{
  Arena *arena;
  bool bVar1;
  int __old_val;
  int iVar2;
  void **ppvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  Rep *pRVar5;
  int iVar6;
  
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           this->tagged_rep_or_elem_;
  arena = this->arena_;
  if (pbVar4 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    this->current_size_ = 1;
    pbVar4 = Arena::Create<std::__cxx11::string>(arena);
    this->tagged_rep_or_elem_ = pbVar4;
  }
  else if (((ulong)pbVar4 & 1) == 0) {
    if (this->current_size_ == 0) {
      this->current_size_ = 1;
    }
    else {
      ppvVar3 = InternalExtend(this,1);
      pbVar4 = Arena::Create<std::__cxx11::string>(arena);
      *ppvVar3 = pbVar4;
      pRVar5 = rep(this);
      pRVar5->allocated_size = 2;
      this->current_size_ = 2;
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*ppvVar3;
    }
  }
  else {
    pRVar5 = rep(this);
    bVar1 = SizeAtCapacity(this);
    if (bVar1) {
      InternalExtend(this,1);
      pRVar5 = rep(this);
      iVar2 = this->current_size_;
      iVar6 = pRVar5->allocated_size;
    }
    else {
      iVar2 = this->current_size_;
      iVar6 = iVar2;
      if (iVar2 != pRVar5->allocated_size) {
        this->current_size_ = iVar2 + 1;
        return pRVar5->elements[iVar2];
      }
    }
    pRVar5->allocated_size = iVar6 + 1;
    this->current_size_ = iVar2 + 1;
    pbVar4 = Arena::Create<std::__cxx11::string>(arena);
    pRVar5->elements[iVar2] = pbVar4;
  }
  return pbVar4;
}

Assistant:

void* RepeatedPtrFieldBase::AddString() {
  return AddInternal([](Arena* arena) { return NewStringElement(arena); });
}